

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O2

bool __thiscall
chrono::ChFunction_Sequence::InsertFunct
          (ChFunction_Sequence *this,shared_ptr<chrono::ChFunction> *myfx,double duration,
          double weight,bool c0,bool c1,bool c2,int position)

{
  list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *this_00;
  long lVar1;
  bool bVar2;
  const_iterator __position;
  ChFseqNode mfxsegment;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_90;
  ChFseqNode local_80;
  
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,&myfx->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>);
  ChFseqNode::ChFseqNode(&local_80,(shared_ptr<chrono::ChFunction> *)&local_90,duration);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  this_00 = &this->functions;
  local_80.weight = weight;
  local_80.y_cont = c0;
  local_80.ydt_cont = c1;
  local_80.ydtdt_cont = c2;
  if (position == -1) {
    bVar2 = true;
    std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>::push_back
              (this_00,&local_80);
  }
  else {
    lVar1 = (long)position + 1;
    __position._M_node = (_List_node_base *)this_00;
    do {
      __position._M_node = (__position._M_node)->_M_next;
      if (__position._M_node == (_List_node_base *)this_00) {
        std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>::push_back
                  (this_00,&local_80);
        bVar2 = false;
        goto LAB_00dcda14;
      }
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
    bVar2 = true;
    std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>::insert
              (this_00,__position,&local_80);
  }
LAB_00dcda14:
  Setup(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.fx.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar2;
}

Assistant:

bool ChFunction_Sequence::InsertFunct(std::shared_ptr<ChFunction> myfx,
                                      double duration,
                                      double weight,
                                      bool c0,
                                      bool c1,
                                      bool c2,
                                      int position) {
    ChFseqNode mfxsegment(myfx, duration);
    mfxsegment.y_cont = c0;
    mfxsegment.ydt_cont = c1;
    mfxsegment.ydtdt_cont = c2;
    mfxsegment.weight = weight;

    bool inserted = false;

    if (position == -1) {
        functions.push_back(mfxsegment);
        inserted = true;
    }
    if (!inserted) {
        std::list<ChFseqNode>::iterator iter;
        size_t i = 0;
        for (iter = functions.begin(); iter != functions.end(); ++iter, ++i) {
            if (i == position) {
                functions.insert(iter, mfxsegment);
                inserted = true;
                break;
            }
        }
    }
    if (!inserted) {
        functions.push_back(mfxsegment);
    }
    // update the continuity offsets and timings
    this->Setup();
    return inserted;
}